

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibCore.cpp
# Opt level: O0

void Jinx::Impl::DebugWriteInternal(LogLevel level,Variant *var)

{
  bool bVar1;
  element_type *this;
  reference ppVar2;
  char *format;
  char *cstr;
  String str;
  pair<const_Jinx::Variant,_Jinx::Variant> *v;
  iterator __end3;
  iterator __begin3;
  element_type *__range3;
  CollectionPtr coll;
  Variant *var_local;
  LogLevel level_local;
  
  coll.
  super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)var;
  bVar1 = Jinx::Variant::IsCollection(var);
  if (bVar1) {
    Jinx::Variant::GetCollection((Variant *)&__range3);
    this = std::
           __shared_ptr_access<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&__range3);
    __end3 = std::
             map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>
             ::begin(this);
    v = (pair<const_Jinx::Variant,_Jinx::Variant> *)
        std::
        map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>
        ::end(this);
    while( true ) {
      bVar1 = std::operator!=(&__end3,(_Self *)&v);
      if (!bVar1) break;
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>::operator*
                         (&__end3);
      DebugWriteInternal(level,&ppVar2->second);
      std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>::operator++(&__end3);
    }
    std::
    shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
    ::~shared_ptr((shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
                   *)&__range3);
  }
  else {
    Jinx::Variant::GetString_abi_cxx11_
              ((String *)&cstr,
               (Variant *)
               coll.
               super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    format = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&cstr)
    ;
    if (format != (char *)0x0) {
      LogWrite(level,format);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&cstr);
  }
  return;
}

Assistant:

inline_t void DebugWriteInternal(LogLevel level, const Variant & var)
	{
		if (var.IsCollection())
		{
			auto coll = var.GetCollection();
			for (const auto & v : *coll)
			{
				DebugWriteInternal(level, v.second);
			}
		}
		else
		{
			auto str = var.GetString();
			auto cstr = str.c_str();
			if (cstr)
				LogWrite(level, cstr);
		}
	}